

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void CMWriteQueuedData(transport_entry_conflict trans,CMConnection conn)

{
  queued_data_rec *__dest;
  char **ppcVar1;
  CMbuffer p_Var2;
  FILE *pFVar3;
  FFSEncodeVector pFVar4;
  int iVar5;
  __pid_t _Var6;
  FFSEncodeVector pFVar7;
  size_t sVar8;
  pthread_t pVar9;
  size_t sVar10;
  size_t __n;
  long lVar11;
  int iVar12;
  FFSEncodeVector pFVar13;
  long lVar14;
  ssize_t sVar15;
  timespec ts;
  timespec ts_1;
  timespec local_58;
  timespec local_40;
  
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    if (iVar5 != 0) goto LAB_0011efa8;
  }
  else if (CMtrace_val[3] != 0) {
LAB_0011efa8:
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)conn->cm->CMTrace_file;
      _Var6 = getpid();
      pVar9 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"CMWriteQueuedData, conn %p, header %zd, attr %zd\n",conn
            ,(conn->queued_data).rem_header_len,(conn->queued_data).rem_attr_len);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  sVar8 = (conn->queued_data).rem_header_len;
  if (sVar8 == 0) {
LAB_0011f1ba:
    sVar8 = (conn->queued_data).rem_attr_len;
    if (sVar8 != 0) {
      local_58.tv_sec = (__time_t)(conn->queued_data).rem_attr_base;
      iVar12 = 0;
      local_58.tv_nsec = sVar8;
      iVar5 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,&local_58,1,(attr_list)0x0);
      if (iVar5 == -1) {
        iVar12 = 2;
      }
      else {
        lVar11 = (long)iVar5;
        sVar8 = (conn->queued_data).rem_attr_len;
        sVar10 = sVar8 - lVar11;
        if (sVar10 != 0 && lVar11 <= (long)sVar8) {
          (conn->queued_data).rem_attr_len = sVar10;
          ppcVar1 = &(conn->queued_data).rem_attr_base;
          *ppcVar1 = *ppcVar1 + lVar11;
          iVar5 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar5 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar5 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)conn->cm->CMTrace_file;
              _Var6 = getpid();
              pVar9 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "CMWriteQueuedData, conn %p, remaining attr %zd\n",conn,
                    (conn->queued_data).rem_attr_len);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          iVar12 = 1;
        }
      }
      if (iVar12 == 2) goto LAB_0011f5ca;
      if (iVar12 != 0) {
        return;
      }
    }
    pFVar13 = (conn->queued_data).vector_data;
    if (pFVar13 != (FFSEncodeVector)0x0) {
      if (pFVar13->iov_base == (void *)0x0) {
        sVar15 = 0;
        lVar11 = 0;
      }
      else {
        lVar11 = 0;
        sVar15 = 0;
        pFVar4 = pFVar13;
        do {
          pFVar7 = pFVar4 + 1;
          sVar15 = sVar15 + 1;
          lVar11 = lVar11 + pFVar4->iov_len;
          pFVar4 = pFVar7;
        } while (pFVar7->iov_base != (void *)0x0);
      }
      iVar12 = 0;
      iVar5 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,pFVar13,sVar15,(attr_list)0x0);
      if (iVar5 == -1) {
        iVar12 = 2;
      }
      else {
        lVar14 = (long)iVar5;
        if (lVar14 < lVar11) {
          iVar5 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar5 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar5 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)conn->cm->CMTrace_file;
              _Var6 = getpid();
              pVar9 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_58);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                      local_58.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "Continued partial pending write, %zu bytes sent\n",lVar14);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          sVar8 = pFVar13->iov_len;
          if ((long)sVar8 < lVar14) {
            do {
              lVar14 = lVar14 - sVar8;
              sVar15 = sVar15 + -1;
              sVar8 = pFVar13[1].iov_len;
              pFVar13 = pFVar13 + 1;
            } while ((long)sVar8 < lVar14);
          }
          pFVar13->iov_len = sVar8 - lVar14;
          pFVar13->iov_base = (void *)((long)pFVar13->iov_base + lVar14);
          (conn->queued_data).vector_data = pFVar13;
          iVar5 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar5 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar5 != 0) {
            if (CMtrace_PID != 0) {
              pFVar3 = (FILE *)conn->cm->CMTrace_file;
              _Var6 = getpid();
              pVar9 = pthread_self();
              fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_58);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                      local_58.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "CMWriteQueuedData, conn %p, %zu remaining data vectors\n",conn,sVar15);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          iVar12 = 1;
        }
      }
      if (iVar12 == 2) goto LAB_0011f5ca;
      if (iVar12 != 0) {
        return;
      }
    }
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    iVar5 = CManager_locked(conn->cm);
    if (iVar5 == 0) {
      puts("Not LOCKED in write queued data!");
    }
  }
  else {
    __dest = &conn->queued_data;
    iVar12 = 0;
    local_58.tv_sec = (__time_t)__dest;
    local_58.tv_nsec = sVar8;
    iVar5 = (*trans->NBwritev_func)
                      (&CMstatic_trans_svcs,conn->transport_data,&local_58,1,(attr_list)0x0);
    if (iVar5 == -1) {
      iVar12 = 2;
    }
    else {
      lVar11 = (long)iVar5;
      sVar8 = (conn->queued_data).rem_header_len;
      __n = sVar8 - lVar11;
      if (__n != 0 && lVar11 <= (long)sVar8) {
        (conn->queued_data).rem_header_len = __n;
        memmove(__dest,__dest->rem_header + lVar11,__n);
        iVar5 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)conn->cm->CMTrace_file;
            _Var6 = getpid();
            pVar9 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec)
            ;
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "CMWriteQueuedData, conn %p, remaining header %zd\n",conn,
                  (conn->queued_data).rem_header_len);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        iVar12 = 1;
      }
    }
    if (iVar12 != 2) {
      if (iVar12 != 0) {
        return;
      }
      goto LAB_0011f1ba;
    }
LAB_0011f5ca:
    iVar5 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)conn->cm->CMTrace_file;
        _Var6 = getpid();
        pVar9 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar9);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
  }
  cm_wake_any_pending_write(conn);
  return;
}

Assistant:

extern void CMWriteQueuedData(transport_entry trans, CMConnection conn)
 {
     attr_list attrs = NULL;  /* GSE fix */
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, header %zd, attr %zd\n", 
		 conn, conn->queued_data.rem_header_len, 
		 conn->queued_data.rem_attr_len);
     if (conn->queued_data.rem_header_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_header;
	 tmp_vec[0].iov_len = conn->queued_data.rem_header_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_header_len) {
	     conn->queued_data.rem_header_len -= actual;
	     memmove(&conn->queued_data.rem_header[0],
		     &conn->queued_data.rem_header[actual],
		     conn->queued_data.rem_header_len);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining header %zd\n", 
			 conn, conn->queued_data.rem_header_len);
	     return;
	 }
     }
     if (conn->queued_data.rem_attr_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_attr_base;
	 tmp_vec[0].iov_len = conn->queued_data.rem_attr_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_attr_len) {
	     conn->queued_data.rem_attr_len -= actual;
	     conn->queued_data.rem_attr_base += actual;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining attr %zd\n", 
			 conn, conn->queued_data.rem_attr_len);
	     return;
	 }
     }
     if (conn->queued_data.vector_data) {
	 size_t vec_count = 0;
	 size_t length = 0;
	 FFSEncodeVector vec = conn->queued_data.vector_data;
	 ssize_t actual = 0;

	 while(vec[vec_count].iov_base != NULL) {
	     length += vec[vec_count].iov_len;
	     vec_count++;
	 }
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    vec, vec_count,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)length) {
	     int i = 0;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Continued partial pending write, %zu bytes sent\n", actual);
	     while (actual > (ssize_t)vec[i].iov_len) {
		 actual -= vec[i].iov_len;
		 i++;
		 vec_count--;
	     }
	     vec[i].iov_len -= actual;
	     vec[i].iov_base = (char*)vec[i].iov_base + actual;
	     conn->queued_data.vector_data = &vec[i];
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, %zu remaining data vectors\n", 
			 conn, vec_count);
	     return;
	 }
     }
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);

     if(!CManager_locked(conn->cm)) {
	 printf("Not LOCKED in write queued data!\n");
     }
     cm_wake_any_pending_write(conn);
     return;
  failed:
     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
     INT_CMConnection_failed(conn);
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
	 conn->queued_data.buffer_to_free = NULL;
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);
     cm_wake_any_pending_write(conn);
     return;
 }